

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.h
# Opt level: O3

FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
* __thiscall
spvtools::opt::
MakeFilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
          (FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
           *__return_storage_ptr__,opt *this,
          _Node_iterator<spvtools::opt::Instruction_*,_true,_false> *begin,
          _Node_iterator<spvtools::opt::Instruction_*,_true,_false> *end,
          ExcludePhiDefinedInBlock predicate)

{
  bool bVar1;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 uVar2;
  
  (__return_storage_ptr__->cur_).super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
  _M_cur = (__node_type *)this;
  (__return_storage_ptr__->end_).super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
  _M_cur = (__node_type *)begin;
  (__return_storage_ptr__->predicate_).context_ = (IRContext *)end;
  (__return_storage_ptr__->predicate_).bb_ = (BasicBlock *)predicate.context_;
  bVar1 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
          ::IsPredicateSatisfied(__return_storage_ptr__);
  uVar2 = extraout_var;
  if (this != (opt *)begin && !bVar1) {
    do {
      this = (opt *)(((__node_type *)this)->super__Hash_node_base)._M_nxt;
      (__return_storage_ptr__->cur_).super__Node_iterator_base<spvtools::opt::Instruction_*,_false>.
      _M_cur = (__node_type *)this;
      bVar1 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
              ::IsPredicateSatisfied(__return_storage_ptr__);
      uVar2 = extraout_var_00;
    } while (!bVar1);
  }
  return (FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_spvtools::opt::(anonymous_namespace)::ExcludePhiDefinedInBlock>
          *)CONCAT71(uVar2,bVar1);
}

Assistant:

FilterIterator<SubIterator, Predicate> MakeFilterIterator(
    const SubIterator& begin, const SubIterator& end, Predicate predicate) {
  return MakeFilterIterator(make_range(begin, end), predicate);
}